

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

void __thiscall
soul::heart::Parser::scanTopLevelItem
          (Parser *this,CodeLocation *moduleLocation,
          vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
          *scannedTopLevelItems,Module *newModule)

{
  undefined1 local_200 [8];
  string local_1f8;
  TokenisedPathString local_1d8;
  string local_120;
  string local_100;
  pool_ptr<soul::Module> local_d0;
  undefined1 local_c8 [8];
  ScannedTopLevelItem newItem;
  Module *newModule_local;
  vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
  *scannedTopLevelItems_local;
  CodeLocation *moduleLocation_local;
  Parser *this_local;
  
  newItem.stateVariableDecls.super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)newModule;
  ScannedTopLevelItem::ScannedTopLevelItem((ScannedTopLevelItem *)local_c8,newModule);
  pool_ptr<soul::Module>::pool_ptr<soul::Module,void>
            (&local_d0,
             (Module *)
             newItem.stateVariableDecls.
             super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  (this->module).object = local_d0.object;
  pool_ptr<soul::Module>::~pool_ptr(&local_d0);
  CodeLocation::operator=
            ((CodeLocation *)
             (newItem.stateVariableDecls.
              super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + 0x22),moduleLocation);
  readQualifiedGeneralIdentifier_abi_cxx11_(&local_100,this);
  std::__cxx11::string::operator=
            ((string *)
             (newItem.stateVariableDecls.
              super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + 6),(string *)&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::operator=
            ((string *)
             (newItem.stateVariableDecls.
              super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + 10),
             (string *)
             (newItem.stateVariableDecls.
              super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + 6));
  std::__cxx11::string::string
            ((string *)(local_200 + 8),
             (string *)
             (newItem.stateVariableDecls.
              super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + 6));
  TokenisedPathString::TokenisedPathString(&local_1d8,(string *)(local_200 + 8));
  TokenisedPathString::getLastPart_abi_cxx11_(&local_120,&local_1d8);
  std::__cxx11::string::operator=
            ((string *)
             (newItem.stateVariableDecls.
              super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + 2),(string *)&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  TokenisedPathString::~TokenisedPathString(&local_1d8);
  std::__cxx11::string::~string((string *)(local_200 + 8));
  parseAnnotation(this,(Annotation *)
                       (newItem.stateVariableDecls.
                        super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage + 0x1a));
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  getCurrentTokeniserPosition
            ((Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              *)local_200);
  UTF8Reader::operator=((UTF8Reader *)&newItem,(UTF8Reader *)local_200);
  scanTopLevelItems(this,(ScannedTopLevelItem *)local_c8);
  std::
  vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
  ::push_back(scannedTopLevelItems,(value_type *)local_c8);
  ScannedTopLevelItem::~ScannedTopLevelItem((ScannedTopLevelItem *)local_c8);
  return;
}

Assistant:

void scanTopLevelItem (const CodeLocation& moduleLocation, std::vector<ScannedTopLevelItem>& scannedTopLevelItems, Module& newModule)
    {
        ScannedTopLevelItem newItem (newModule);
        module = newModule;

        newModule.location = moduleLocation;
        newModule.fullName = readQualifiedGeneralIdentifier();
        newModule.originalFullName = newModule.fullName;
        newModule.shortName = TokenisedPathString (newModule.fullName).getLastPart();
        parseAnnotation (newModule.annotation);
        newItem.moduleStartPos = getCurrentTokeniserPosition();
        scanTopLevelItems (newItem);
        scannedTopLevelItems.push_back (std::move (newItem));
    }